

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.c
# Opt level: O3

void base64_encode_binary(uchar *in,char *out,int len)

{
  ulong uVar1;
  uchar uVar2;
  int iVar3;
  int iVar4;
  uchar *__ptr;
  ulong uVar5;
  uchar *puVar6;
  int iVar7;
  ulong uVar8;
  uchar *puVar9;
  unsigned_long olen;
  ulong local_38;
  
  uVar8 = (ulong)len;
  local_38 = compressBound(uVar8);
  __ptr = (uchar *)malloc(local_38);
  iVar3 = compress2(__ptr,&local_38,in,uVar8,9);
  if (iVar3 != 0) {
    panic("Could not compress input data!");
  }
  iVar4 = 0;
  iVar3 = sprintf(out,"$%d$",(ulong)(uint)len);
  puVar9 = __ptr;
  uVar1 = local_38;
  if (uVar8 <= local_38 + (long)iVar3) {
    iVar3 = 0;
    puVar9 = in;
    uVar1 = uVar8;
  }
  uVar8 = (uVar1 / 3) * 3;
  if (uVar8 == 0) {
    uVar5 = 0;
  }
  else {
    puVar6 = (uchar *)(out + (long)iVar3 + 3);
    uVar5 = 0;
    do {
      puVar6[-3] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                   [puVar9[uVar5] >> 2];
      puVar6[-2] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                   [(uint)(puVar9[uVar5 + 1] >> 4) | (puVar9[uVar5] & 3) << 4];
      puVar6[-1] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                   [(uint)(puVar9[uVar5 + 2] >> 6) + (puVar9[uVar5 + 1] & 0xf) * 4];
      *puVar6 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                [puVar9[uVar5 + 2] & 0x3f];
      uVar5 = uVar5 + 3;
      puVar6 = puVar6 + 4;
      iVar3 = iVar3 + 4;
    } while (uVar5 < uVar8);
    iVar4 = (int)uVar5;
  }
  iVar7 = (int)uVar1 - iVar4;
  if (0 < iVar7) {
    out[iVar3] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                 [puVar9[uVar5] >> 2];
    uVar8 = (ulong)((puVar9[uVar5] & 3) << 4);
    if (iVar7 == 1) {
      out[(long)iVar3 + 1] =
           "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[uVar8];
      uVar2 = '=';
    }
    else {
      out[(long)iVar3 + 1] =
           "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
           [puVar9[(long)iVar4 + 1] >> 4 | uVar8];
      uVar2 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
              [(ulong)(puVar9[(long)iVar4 + 1] & 0xf) * 4];
    }
    out[(long)iVar3 + 2] = uVar2;
    out[(long)iVar3 + 3] = '=';
    iVar3 = iVar3 + 4;
  }
  free(__ptr);
  out[iVar3] = '\0';
  return;
}

Assistant:

static void base64_encode_binary(const unsigned char* in, char *out, int len)
{
    int i, pos, rem;
    unsigned long olen = compressBound(len);
    unsigned char *o = malloc(olen);

    if (compress2(o, &olen, in, len, Z_BEST_COMPRESSION) != Z_OK)
	panic("Could not compress input data!");

    pos = sprintf(out, "$%d$", len);
    if (pos + olen >= len) {
	pos = 0;
	olen = len;
    } else {
	in = o;
    }

    for (i = 0; i < (olen / 3) * 3; i += 3) {
	out[pos  ] = b64e[ in[i  ]         >> 2];
	out[pos+1] = b64e[(in[i  ] & 0x03) << 4 | (in[i+1] & 0xf0) >> 4];
	out[pos+2] = b64e[(in[i+1] & 0x0f) << 2 | (in[i+2] & 0xc0) >> 6];
	out[pos+3] = b64e[ in[i+2] & 0x3f];
	pos += 4;
    }

    rem = olen - i;
    if (rem > 0) {
	out[pos  ] = b64e[ in[i  ]         >> 2];
	out[pos+1] = b64e[(in[i  ] & 0x03) << 4 |
			 (rem == 1 ? 0 :
			  (in[i+1] & 0xf0) >> 4)];
	out[pos+2] = (rem == 1) ? '=' :
		     b64e[(in[i+1] & 0x0f) << 2];
	out[pos+3] = '=';
	pos += 4;
    }

    free(o);

    out[pos] = '\0';
}